

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void __thiscall
SmallArray<CompilerStatistics::Timer,_16U>::grow
          (SmallArray<CompilerStatistics::Timer,_16U> *this,uint newSize)

{
  undefined4 *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  Timer *pTVar4;
  uint count;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  Timer *pTVar10;
  long lVar11;
  uint i;
  uint uVar12;
  ulong uVar13;
  
  uVar12 = (this->max >> 1) + this->max;
  count = newSize + 4;
  if (newSize < uVar12) {
    count = uVar12;
  }
  if (this->allocator == (Allocator *)0x0) {
    pTVar10 = (Timer *)(*(code *)NULLC::alloc)(count * 0x28 | 4);
    if (count != 0) {
      lVar11 = 0;
      do {
        *(undefined4 *)((long)&pTVar10->total + lVar11) = 0;
        puVar2 = (undefined8 *)((long)&(pTVar10->outputName).begin + lVar11);
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2 = (undefined8 *)((long)&(pTVar10->keyName).begin + lVar11);
        *puVar2 = 0;
        puVar2[1] = 0;
        lVar11 = lVar11 + 0x28;
      } while ((long)(int)count * 0x28 - lVar11 != 0);
    }
  }
  else {
    pTVar10 = Allocator::construct<CompilerStatistics::Timer>(this->allocator,count);
  }
  lVar11 = 0;
  uVar13 = 0;
  while( true ) {
    pTVar4 = this->data;
    if (this->count <= uVar13) break;
    *(undefined4 *)((long)&pTVar10->total + lVar11) = *(undefined4 *)((long)&pTVar4->total + lVar11)
    ;
    puVar1 = (undefined4 *)((long)&(pTVar4->keyName).begin + lVar11);
    uVar5 = *puVar1;
    uVar6 = puVar1[1];
    uVar7 = puVar1[2];
    uVar8 = puVar1[3];
    puVar2 = (undefined8 *)((long)&(pTVar4->outputName).begin + lVar11);
    uVar9 = puVar2[1];
    puVar3 = (undefined8 *)((long)&(pTVar10->outputName).begin + lVar11);
    *puVar3 = *puVar2;
    puVar3[1] = uVar9;
    puVar1 = (undefined4 *)((long)&(pTVar10->keyName).begin + lVar11);
    *puVar1 = uVar5;
    puVar1[1] = uVar6;
    puVar1[2] = uVar7;
    puVar1[3] = uVar8;
    uVar13 = uVar13 + 1;
    lVar11 = lVar11 + 0x28;
  }
  if (pTVar4 != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      if (pTVar4 != (Timer *)0x0) {
        (*(code *)NULLC::dealloc)(pTVar4);
      }
    }
    else if (pTVar4 != (Timer *)0x0) {
      (*this->allocator->_vptr_Allocator[3])();
    }
  }
  this->data = pTVar10;
  this->max = count;
  return;
}

Assistant:

void grow(unsigned newSize)
	{
		if(max + (max >> 1) > newSize)
			newSize = max + (max >> 1);
		else
			newSize += 4;

		T* newData = 0;
		
		if(allocator)
			newData = allocator->construct<T>(newSize);
		else
			newData = NULLC::construct<T>(newSize);

		for(unsigned i = 0; i < count; i++)
			newData[i] = data[i];

		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}

		data = newData;

		max = newSize;
	}